

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_input_attachment_aspect
          (Impl *this,Value *state,VkRenderPassInputAttachmentAspectCreateInfo **out_info)

{
  uint uVar1;
  size_t size;
  VkRenderPassInputAttachmentAspectCreateInfo *pVVar2;
  Type pGVar3;
  VkInputAttachmentAspectReference *__s;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar4;
  Type pGVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  
  pVVar2 = (VkRenderPassInputAttachmentAspectCreateInfo *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar2 != (VkRenderPassInputAttachmentAspectCreateInfo *)0x0) {
    *(undefined8 *)&pVVar2->aspectReferenceCount = 0;
    pVVar2->pAspectReferences = (VkInputAttachmentAspectReference *)0x0;
    *(undefined8 *)pVVar2 = 0;
    pVVar2->pNext = (void *)0x0;
  }
  *out_info = pVVar2;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"aspectReferences");
  if ((pGVar3->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar1 = (pGVar3->data_).s.length;
  pVVar2->aspectReferenceCount = uVar1;
  if ((ulong)uVar1 == 0) {
    __s = (VkInputAttachmentAspectReference *)0x0;
  }
  else {
    size = (ulong)uVar1 * 0xc;
    __s = (VkInputAttachmentAspectReference *)
          ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (__s != (VkInputAttachmentAspectReference *)0x0) {
      memset(__s,0,size);
    }
  }
  pVVar2->pAspectReferences = __s;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"aspectReferences");
  if ((pGVar3->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x68c,
                  "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(pGVar3->data_).s.str & 0xffffffffffff);
  pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(pGVar3);
  if (pGVar4 != this_00) {
    do {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"subpass");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) {
LAB_001336af:
        __assert_fail("data_.f.flags & kUintFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      __s->subpass = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"inputAttachmentIndex");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_001336af;
      __s->inputAttachmentIndex = (pGVar5->data_).s.length;
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"aspectMask");
      if ((undefined1  [16])((undefined1  [16])pGVar5->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_001336af;
      __s->aspectMask = (pGVar5->data_).s.length;
      this_00 = this_00 + 0x10;
      __s = __s + 1;
      pGVar4 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(pGVar3);
    } while (this_00 != pGVar4);
  }
  *out_info = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_input_attachment_aspect(const Value &state,
						        VkRenderPassInputAttachmentAspectCreateInfo **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderPassInputAttachmentAspectCreateInfo>();
	*out_info = info;

	info->aspectReferenceCount = state["aspectReferences"].Size();

	auto *new_aspects = allocator.allocate_n_cleared<VkInputAttachmentAspectReference>(info->aspectReferenceCount);
	info->pAspectReferences = new_aspects;

	auto &aspects = state["aspectReferences"];
	for (auto aspect_itr = aspects.Begin(); aspect_itr != aspects.End(); ++aspect_itr, new_aspects++)
	{
		auto &aspect = *aspect_itr;
		new_aspects->subpass = aspect["subpass"].GetUint();
		new_aspects->inputAttachmentIndex = aspect["inputAttachmentIndex"].GetUint();
		new_aspects->aspectMask = static_cast<VkImageAspectFlags>(aspect["aspectMask"].GetUint());
	}

	*out_info = info;
	return true;
}